

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

void __thiscall Am_Point_List_Data::Print(Am_Point_List_Data *this,ostream *os)

{
  ostream *poVar1;
  Am_Point_Item *local_20;
  Am_Point_Item *current;
  ostream *os_local;
  Am_Point_List_Data *this_local;
  
  poVar1 = std::operator<<(os,"LIST(");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(ushort *)&(this->super_Am_Wrapper).field_0xc);
  std::operator<<(poVar1,") [");
  for (local_20 = this->head; local_20 != this->tail; local_20 = local_20->next) {
    poVar1 = std::operator<<(os,'(');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->x);
    poVar1 = std::operator<<(poVar1,',');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->y);
    std::operator<<(poVar1,") ");
  }
  if (local_20 != (Am_Point_Item *)0x0) {
    poVar1 = std::operator<<(os,'(');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->x);
    poVar1 = std::operator<<(poVar1,',');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->y);
    std::operator<<(poVar1,')');
  }
  std::operator<<(os,"]");
  return;
}

Assistant:

void
Am_Point_List_Data::Print(std::ostream &os) const
{
  Am_Point_Item *current;
  os << "LIST(" << number << ") [";
  for (current = head; current != tail; current = current->next) {
    os << '(' << current->x << ',' << current->y << ") ";
  }
  if (current) {
    os << '(' << current->x << ',' << current->y << ')';
  }
  os << "]";
}